

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O2

void __thiscall
cppcms::impl::details::intrusive_list<$b487a5d2$>::insert_after
          (intrusive_list<_b487a5d2_> *this,container *p,container *after_me)

{
  container *pcVar1;
  
  pcVar1 = after_me->next;
  if (pcVar1 != (container *)0x0) {
    p->prev = after_me;
    p->next = pcVar1;
    if (after_me->next != (container *)0x0) {
      after_me->next->prev = p;
    }
    after_me->next = p;
    return;
  }
  push_back(this,p);
  return;
}

Assistant:

void insert_after(T *p,T *after_me)
	{
		if(!after_me->next) {
			push_back(p);
			return;
		}
		p->prev = after_me;
		p->next = after_me->next;
		if(after_me->next)
			after_me->next->prev = p;
		after_me->next = p;
	}